

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3ExprCompareSkip(Expr *pA,Expr *pB,int iTab)

{
  int iVar1;
  ExprList_item *pEVar2;
  
  if (pA != (Expr *)0x0) {
    do {
      if ((pA->flags & 0x82000) == 0) break;
      if ((pA->flags >> 0x13 & 1) == 0) {
        pEVar2 = (ExprList_item *)&pA->pLeft;
      }
      else {
        pEVar2 = ((pA->x).pList)->a;
      }
      pA = pEVar2->pExpr;
    } while (pA != (Expr *)0x0);
  }
  while ((pB != (Expr *)0x0 && ((pB->flags & 0x82000) != 0))) {
    if ((pB->flags >> 0x13 & 1) == 0) {
      pEVar2 = (ExprList_item *)&pB->pLeft;
    }
    else {
      pEVar2 = ((pB->x).pList)->a;
    }
    pB = pEVar2->pExpr;
  }
  iVar1 = sqlite3ExprCompare((Parse *)0x0,pA,pB,iTab);
  return iVar1;
}

Assistant:

SQLITE_PRIVATE int sqlite3ExprCompareSkip(Expr *pA,Expr *pB, int iTab){
  return sqlite3ExprCompare(0,
             sqlite3ExprSkipCollateAndLikely(pA),
             sqlite3ExprSkipCollateAndLikely(pB),
             iTab);
}